

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineQueryResultGame.h
# Opt level: O2

void __thiscall TgBot::InlineQueryResultGame::InlineQueryResultGame(InlineQueryResultGame *this)

{
  InlineQueryResult::InlineQueryResult(&this->super_InlineQueryResult);
  (this->super_InlineQueryResult)._vptr_InlineQueryResult =
       (_func_int **)&PTR__InlineQueryResultGame_002cf1e8;
  (this->gameShortName)._M_dataplus._M_p = (pointer)&(this->gameShortName).field_2;
  (this->gameShortName)._M_string_length = 0;
  (this->gameShortName).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&(this->super_InlineQueryResult).type);
  return;
}

Assistant:

InlineQueryResultGame() {
        this->type = TYPE;
    }